

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_map_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashMap_EmplaceSingle_Test::
~ParallelFlatHashMap_EmplaceSingle_Test(ParallelFlatHashMap_EmplaceSingle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, EmplaceSingle) {
    // --------------------
    // test emplace_single
    // --------------------
    using Map = ThisMap<int, int>;
    Map m = { {1, 4}, {11, 4} };
 
    // emplace_single insert a value if not already present, else removes it
    for (int i=0; i<12; ++i)
        m.emplace_single(i, [i](const Map::constructor& ctor) { ctor(i, 4); });
    EXPECT_EQ(m.count(0), 1);
    EXPECT_EQ(m.count(1), 0);
    EXPECT_EQ(m.count(2), 1);
    EXPECT_EQ(m.count(11), 0);
}